

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O0

vector<core::Intersection,_std::allocator<core::Intersection>_> * __thiscall
geometry::primitive::Triangle::local_intersect
          (vector<core::Intersection,_std::allocator<core::Intersection>_> *__return_storage_ptr__,
          Triangle *this,Ray *ray)

{
  Tuple4d *pTVar1;
  vector<core::Intersection,_std::allocator<core::Intersection>_> *pvVar2;
  double dVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  double dVar5;
  pair<double,_double> uv;
  Intersection local_e0;
  double local_c0;
  double t;
  double v;
  Tuple4d origin_cross_e1;
  double u;
  Tuple4d p1_to_origin;
  double f;
  double det;
  Tuple4d dir_cross_e2;
  Ray *ray_local;
  Triangle *this_local;
  vector<core::Intersection,_std::allocator<core::Intersection>_> *intersects;
  
  dir_cross_e2.m_buffer[3] = (double)ray;
  pTVar1 = core::Ray::direction(ray);
  math::cross((Tuple4d *)&det,pTVar1,(Tuple4d *)&this->field_0x120);
  dVar3 = math::dot((Tuple4d *)&this->field_0x100,(Tuple4d *)&det);
  pvVar2 = __return_storage_ptr__;
  std::vector<core::Intersection,_std::allocator<core::Intersection>_>::vector
            (__return_storage_ptr__);
  std::abs((int)pvVar2);
  if (1e-05 <= extraout_XMM0_Qa) {
    p1_to_origin.m_buffer[3] = 1.0 / dVar3;
    pTVar1 = core::Ray::origin((Ray *)dir_cross_e2.m_buffer[3]);
    math::operator-((Tuple4d *)&u,pTVar1,(Tuple4d *)&this->field_0xa0);
    dVar3 = p1_to_origin.m_buffer[3];
    dVar4 = math::dot((Tuple4d *)&u,(Tuple4d *)&det);
    origin_cross_e1.m_buffer[3] = dVar3 * dVar4;
    if ((0.0 <= origin_cross_e1.m_buffer[3]) && (origin_cross_e1.m_buffer[3] <= 1.0)) {
      math::cross((Tuple4d *)&v,(Tuple4d *)&u,(Tuple4d *)&this->field_0x100);
      dVar3 = p1_to_origin.m_buffer[3];
      pTVar1 = core::Ray::direction((Ray *)dir_cross_e2.m_buffer[3]);
      dVar5 = math::dot(pTVar1,(Tuple4d *)&v);
      dVar4 = p1_to_origin.m_buffer[3];
      t = dVar3 * dVar5;
      if ((0.0 <= t) && (origin_cross_e1.m_buffer[3] + t <= 1.0)) {
        dVar3 = math::dot((Tuple4d *)&this->field_0x120,(Tuple4d *)&v);
        local_c0 = dVar4 * dVar3;
        uv = std::make_pair<double&,double&>(origin_cross_e1.m_buffer + 3,&t);
        core::Intersection::Intersection(&local_e0,dVar4 * dVar3,&this->super_Primitive,uv);
        std::vector<core::Intersection,_std::allocator<core::Intersection>_>::push_back
                  (__return_storage_ptr__,&local_e0);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<core::Intersection> geometry::primitive::Triangle::local_intersect(const core::Ray &ray) const
{
    math::Tuple4d dir_cross_e2 = cross(ray.direction(), m_edges[1]);
    double det = dot(m_edges[0], dir_cross_e2);

    std::vector<core::Intersection> intersects;
    if (std::abs(det) >= constants::EPSILON)
    {
	double f = 1 / det;
	math::Tuple4d p1_to_origin = ray.origin() - m_points[0];
	double u = f * dot(p1_to_origin, dir_cross_e2);
	if (u >= 0 && u <= 1)
	{
	    math::Tuple4d origin_cross_e1 = cross(p1_to_origin, m_edges[0]);
	    double v = f * dot(ray.direction(), origin_cross_e1);
	    if (v >= 0 && (u + v) <= 1)
	    {
		double t = f * dot(m_edges[1], origin_cross_e1);
		intersects.push_back(core::Intersection{t, (Primitive*) this, std::make_pair(u, v)});
	    }
	}
    }
    return intersects;
}